

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O1

dtype __thiscall pybind11::dtype::from_args(dtype *this,object *args)

{
  int iVar1;
  npy_api *pnVar2;
  error_already_set *this_00;
  PyObject *ptr;
  handle local_20;
  
  local_20.m_ptr = (PyObject *)0x0;
  pnVar2 = detail::npy_api::get();
  iVar1 = (*pnVar2->PyArray_DescrConverter_)((args->super_handle).m_ptr,&local_20.m_ptr);
  if ((iVar1 != 0) && (local_20.m_ptr != (PyObject *)0x0)) {
    (this->super_object).super_handle.m_ptr = local_20.m_ptr;
    return (object)(object)this;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

static dtype from_args(object args) {
        PyObject *ptr = nullptr;
        if (!detail::npy_api::get().PyArray_DescrConverter_(args.ptr(), &ptr) || !ptr)
            throw error_already_set();
        return reinterpret_steal<dtype>(ptr);
    }